

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O2

int coda_type_record_field_set_real_name(coda_type_record_field *field,char *real_name)

{
  char *pcVar1;
  undefined8 uVar2;
  
  if (field == (coda_type_record_field *)0x0) {
    pcVar1 = "field argument is NULL (%s:%u)";
    uVar2 = 0x414;
  }
  else {
    if (real_name != (char *)0x0) {
      if (field->real_name != (char *)0x0) {
        coda_set_error(-400,"field already has a real name");
        return -1;
      }
      pcVar1 = strdup(real_name);
      field->real_name = pcVar1;
      if (pcVar1 == (char *)0x0) {
        coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                       "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                       ,0x425);
        return -1;
      }
      return 0;
    }
    pcVar1 = "real_name argument is NULL (%s:%u)";
    uVar2 = 0x419;
  }
  coda_set_error(-100,pcVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                 ,uVar2);
  return -1;
}

Assistant:

int coda_type_record_field_set_real_name(coda_type_record_field *field, const char *real_name)
{
    if (field == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "field argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (real_name == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "real_name argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (field->real_name != NULL)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "field already has a real name");
        return -1;
    }
    field->real_name = strdup(real_name);
    if (field->real_name == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate string) (%s:%u)", __FILE__,
                       __LINE__);
        return -1;
    }

    return 0;
}